

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O1

void cleanup_parse_ui_entry(void)

{
  long lVar1;
  
  if (L'\0' < n_entry) {
    lVar1 = 0;
    do {
      string_free(entries[lVar1]->name);
      mem_free(entries[lVar1]->categories);
      mem_free(entries[lVar1]->obj_props);
      mem_free(entries[lVar1]->p_abilities);
      mem_free(entries[lVar1]->label);
      mem_free(entries[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < n_entry);
  }
  mem_free(entries);
  n_entry = L'\0';
  nalloc_entry = L'\0';
  entries = (ui_entry **)0x0;
  if (L'\0' < n_category) {
    lVar1 = 0;
    do {
      string_free(categories[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < n_category);
  }
  mem_free(categories);
  n_category = L'\0';
  nalloc_category = L'\0';
  categories = (char **)0x0;
  return;
}

Assistant:

static void cleanup_parse_ui_entry(void)
{
	int i;

	for (i = 0; i < n_entry; ++i) {
		string_free(entries[i]->name);
		mem_free(entries[i]->categories);
		mem_free(entries[i]->obj_props);
		mem_free(entries[i]->p_abilities);
		mem_free(entries[i]->label);
		mem_free(entries[i]);
	}
	mem_free(entries);
	n_entry = 0;
	nalloc_entry = 0;
	entries = NULL;

	for (i = 0; i < n_category; ++i) {
		string_free(categories[i]);
	}
	mem_free(categories);
	n_category = 0;
	nalloc_category = 0;
	categories = NULL;
}